

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

float vec3_distance_squared_point_line_segment(vec3 p,vec3 a,vec3 b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 v2;
  vec3 v1;
  vec3 v1_00;
  float f;
  float e;
  vec3 bc;
  vec3 ac;
  vec3 ab;
  vec3 c;
  vec3 b_local;
  vec3 a_local;
  vec3 p_local;
  
  v2 = vec3_sub(b,a);
  v1 = vec3_sub(p,a);
  v1_00 = vec3_sub(p,b);
  fVar1 = vec3_dot(v1,v2);
  if (0.0 < fVar1) {
    fVar2 = vec3_dot(v2,v2);
    if (fVar1 < fVar2) {
      fVar3 = vec3_dot(v1,v1);
      p_local.y = fVar3 - (fVar1 * fVar1) / fVar2;
    }
    else {
      p_local.y = vec3_dot(v1_00,v1_00);
    }
  }
  else {
    p_local.y = vec3_dot(v1,v1);
  }
  return p_local.y;
}

Assistant:

float vec3_distance_squared_point_line_segment(vec3 p, vec3 a, vec3 b) {
    vec3 c = p;
    vec3 ab = vec3_sub(b, a);
    vec3 ac = vec3_sub(c, a);
    vec3 bc = vec3_sub(c, b);
    float e = vec3_dot(ac, ab);
    if (e <= 0.0f) return vec3_dot(ac, ac);
    float f = vec3_dot(ab, ab);
    if (e >= f) return vec3_dot(bc, bc);
    return vec3_dot(ac, ac) - e*e/f;
}